

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_transform.hpp
# Opt level: O0

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::
quadrature_traits<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_void>
::generate(tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,MuraKnowlesRadialTraits *traits)

{
  double dVar1;
  pointer __n;
  int iVar2;
  undefined4 extraout_var;
  __tuple_element_t<0UL,_tuple<vector<double,_allocator<double>_>,_vector<double,_allocator<double>_>_>_>
  *this;
  __tuple_element_t<1UL,_tuple<vector<double,_allocator<double>_>,_vector<double,_allocator<double>_>_>_>
  *this_00;
  reference pvVar3;
  double dVar4;
  double dVar5;
  value_type wi;
  value_type xi;
  size_t i;
  bool ipts_offset;
  type *base_w;
  type *base_x;
  size_t local_78;
  size_t npts_base;
  undefined1 local_68 [8];
  weight_container weights;
  allocator<double> local_39;
  undefined1 local_38 [8];
  point_container points;
  size_t npts;
  MuraKnowlesRadialTraits *traits_local;
  
  iVar2 = (*(traits->super_RadialTraits)._vptr_RadialTraits[3])();
  points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,
             (size_type)CONCAT44(extraout_var,iVar2),&local_39);
  std::allocator<double>::~allocator(&local_39);
  __n = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  std::allocator<double>::allocator((allocator<double> *)((long)&npts_base + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,(size_type)__n,
             (allocator<double> *)((long)&npts_base + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&npts_base + 7));
  local_78 = (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 2;
  quadrature_traits<IntegratorXX::UniformTrapezoid<double,_double>,_void>::generate
            ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&base_x,local_78);
  this = std::
         get<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                   ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                     *)&base_x);
  this_00 = std::
            get<1ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                      ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                        *)&base_x);
  for (xi = 0.0;
      (ulong)xi <
      points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage; xi = (value_type)((long)xi + 1)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)xi + 1);
    dVar5 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)xi + 1);
    dVar1 = *pvVar3;
    dVar4 = MuraKnowlesRadialTraits::radial_transform<double>(traits,dVar5);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(size_type)xi);
    *pvVar3 = dVar4;
    dVar5 = MuraKnowlesRadialTraits::radial_jacobian<double>(traits,dVar5);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,(size_type)xi);
    *pvVar3 = dVar1 * dVar5;
  }
  std::
  make_tuple<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_38,
             (vector<double,_std::allocator<double>_> *)local_68);
  std::
  tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~tuple((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
            *)&base_x);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( const RadialTraitsType& traits ) {

    using base_quad_traits = quadrature_traits<BaseQuad>;

    const auto npts = traits.npts();
    point_container  points( npts );
    weight_container weights( npts );


    const auto npts_base = base_quad_traits::bound_inclusive ? npts+2 : npts;
    auto [base_x, base_w] = base_quad_traits::generate(npts_base);

    const auto ipts_offset = !!base_quad_traits::bound_inclusive;
    for(size_t i = 0; i < npts; ++i) {
      const auto xi = base_x[i + ipts_offset];
      const auto wi = base_w[i + ipts_offset];
      points[i]  = traits.radial_transform(xi);
      weights[i] = wi * traits.radial_jacobian(xi);
    }

    return std::make_tuple(points, weights);
  }